

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

char * x509v3_bytes_to_hex(uint8_t *in,size_t len)

{
  int iVar1;
  size_t local_68;
  size_t unused_len;
  uint8_t *ret;
  size_t i;
  CBB cbb;
  size_t len_local;
  uint8_t *in_local;
  
  cbb.u._24_8_ = len;
  iVar1 = CBB_init((CBB *)&i,len * 3 + 1);
  if (iVar1 != 0) {
    for (ret = (uint8_t *)0x0; ret < (ulong)cbb.u._24_8_; ret = ret + 1) {
      if ((((ret != (uint8_t *)0x0) && (iVar1 = CBB_add_u8((CBB *)&i,':'), iVar1 == 0)) ||
          (iVar1 = CBB_add_u8((CBB *)&i,"0123456789ABCDEF"[(int)(uint)in[(long)ret] >> 4]),
          iVar1 == 0)) ||
         (iVar1 = CBB_add_u8((CBB *)&i,"0123456789ABCDEF"[(int)(in[(long)ret] & 0xf)]), iVar1 == 0))
      goto LAB_0024b029;
    }
    iVar1 = CBB_add_u8((CBB *)&i,'\0');
    if ((iVar1 != 0) &&
       (iVar1 = CBB_finish((CBB *)&i,(uint8_t **)&unused_len,&local_68), iVar1 != 0)) {
      return (char *)unused_len;
    }
  }
LAB_0024b029:
  CBB_cleanup((CBB *)&i);
  return (char *)0x0;
}

Assistant:

char *x509v3_bytes_to_hex(const uint8_t *in, size_t len) {
  CBB cbb;
  if (!CBB_init(&cbb, len * 3 + 1)) {
    goto err;
  }
  for (size_t i = 0; i < len; i++) {
    static const char hex[] = "0123456789ABCDEF";
    if ((i > 0 && !CBB_add_u8(&cbb, ':')) ||
        !CBB_add_u8(&cbb, hex[in[i] >> 4]) ||
        !CBB_add_u8(&cbb, hex[in[i] & 0xf])) {
      goto err;
    }
  }
  uint8_t *ret;
  size_t unused_len;
  if (!CBB_add_u8(&cbb, 0) || !CBB_finish(&cbb, &ret, &unused_len)) {
    goto err;
  }

  return (char *)ret;

err:
  CBB_cleanup(&cbb);
  return NULL;
}